

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

Expression cnn::expr::block_dropout(Expression *x,real p)

{
  undefined8 extraout_RDX;
  initializer_list<cnn::VariableIndex> *in_RSI;
  ComputationGraph *in_RDI;
  undefined4 in_XMM0_Da;
  Expression EVar1;
  VariableIndex *i;
  ComputationGraph *pg;
  Expression *this;
  VariableIndex local_2c;
  VariableIndex *local_28;
  undefined8 local_20;
  undefined4 in_stack_ffffffffffffffe8;
  ComputationGraph *this_00;
  
  this = (Expression *)in_RSI->_M_array;
  i = in_RSI->_M_array;
  pg = in_RDI;
  this_00 = in_RDI;
  VariableIndex::VariableIndex(&local_2c,(VariableIndex *)&in_RSI->_M_len);
  local_28 = &local_2c;
  local_20 = 1;
  ComputationGraph::add_function<cnn::BlockDropout,float&>
            (this_00,in_RSI,(float *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe8));
  Expression::Expression(this,pg,i);
  EVar1._8_8_ = extraout_RDX;
  EVar1.pg = in_RDI;
  return EVar1;
}

Assistant:

Expression block_dropout(const Expression& x, real p) { return Expression(x.pg, x.pg->add_function<BlockDropout>({x.i}, p)); }